

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptRegExpConstructor.cpp
# Opt level: O2

void __thiscall Js::JavascriptRegExpConstructor::EnsureValues(JavascriptRegExpConstructor *this)

{
  charcount_t length;
  ScriptContext *scriptContext;
  RegexPattern *pattern;
  code *pcVar1;
  bool bVar2;
  uint16 uVar3;
  charcount_t inputLength;
  Type TVar4;
  CharCount nValue;
  char16 *input;
  GroupInfo GVar5;
  undefined4 *puVar6;
  JavascriptString *ptr;
  Var pvVar7;
  JavascriptString *pJVar8;
  Var pvVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Type *pTVar14;
  
  if (this->reset == true) {
    scriptContext =
         (((((this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
             super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
         .scriptContext.ptr;
    inputLength = JavascriptString::GetLength((this->lastInput).ptr);
    input = JavascriptString::GetString((this->lastInput).ptr);
    pattern = (this->lastPattern).ptr;
    if (this->invalidatedLastMatch == false) {
      TVar4 = (this->lastMatch).length;
    }
    else {
      GVar5 = RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,0);
      (this->lastMatch).offset = GVar5.offset;
      (this->lastMatch).length = GVar5.length;
      this->invalidatedLastMatch = false;
      TVar4 = GVar5.length;
    }
    if (TVar4 == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                  ,0x5d,"(!lastMatch.IsUndefined())","!lastMatch.IsUndefined()");
      if (!bVar2) goto LAB_00baec9d;
      *puVar6 = 0;
    }
    ptr = JavascriptLibrary::GetEmptyString
                    ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    nValue = UnifiedRegex::GroupInfo::EndOffset(&this->lastMatch);
    pvVar7 = JavascriptNumber::ToVar((this->lastMatch).offset,scriptContext);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->index,pvVar7);
    pvVar7 = JavascriptNumber::ToVar(nValue,scriptContext);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->lastIndex,pvVar7);
    length = (this->lastMatch).offset;
    pJVar8 = ptr;
    if (length != 0) {
      pJVar8 = SubString::New((this->lastInput).ptr,0,length);
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->leftContext,pJVar8);
    pJVar8 = ptr;
    if ((nValue <= inputLength && inputLength - nValue != 0) && nValue != 0) {
      pJVar8 = SubString::New((this->lastInput).ptr,nValue,inputLength - nValue);
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->rightContext,pJVar8);
    pvVar7 = RegexHelper::NonMatchValue(scriptContext,true);
    GVar5.offset = (this->lastMatch).offset;
    GVar5.length = (this->lastMatch).length;
    pvVar9 = RegexHelper::GetString(scriptContext,(this->lastInput).ptr,pvVar7,GVar5);
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(this->captures,pvVar9);
    uVar3 = UnifiedRegex::RegexPattern::NumGroups(pattern);
    uVar10 = (uint)uVar3;
    uVar11 = (ulong)uVar10;
    pJVar8 = ptr;
    if (1 < uVar3) {
      bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
      if (!bVar2) {
        RegexHelper::SimpleMatch(scriptContext,pattern,input,inputLength,(this->lastMatch).offset);
      }
      bVar2 = UnifiedRegex::RegexPattern::WasLastMatchSuccessful(pattern);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                    ,0x72,"(pattern->WasLastMatchSuccessful())",
                                    "pattern->WasLastMatchSuccessful()");
        if (!bVar2) {
LAB_00baec9d:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      uVar12 = 10;
      if (uVar10 < 10) {
        uVar12 = (ulong)uVar10;
      }
      pTVar14 = this->captures;
      for (uVar13 = 1; pTVar14 = pTVar14 + 1, uVar13 < uVar12; uVar13 = uVar13 + 1) {
        pvVar9 = RegexHelper::GetGroup
                           (scriptContext,pattern,(this->lastInput).ptr,pvVar7,(int)uVar13);
        Memory::WriteBarrierPtr<void>::WriteBarrierSet(pTVar14,pvVar9);
      }
      if (uVar3 < 0xb) {
        pJVar8 = (JavascriptString *)this->captures[uVar11 - 1].ptr;
      }
      else {
        pJVar8 = (JavascriptString *)
                 RegexHelper::GetGroup
                           (scriptContext,pattern,(this->lastInput).ptr,pvVar7,uVar10 - 1);
      }
    }
    Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->lastParen,pJVar8);
    pTVar14 = this->captures + uVar11;
    for (; uVar11 < 10; uVar11 = uVar11 + 1) {
      Memory::WriteBarrierPtr<void>::WriteBarrierSet(pTVar14,ptr);
      pTVar14 = pTVar14 + 1;
    }
    this->reset = false;
  }
  else if (this->invalidatedLastMatch == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptRegExpConstructor.cpp"
                                ,0x85,"(!invalidatedLastMatch)","!invalidatedLastMatch");
    if (!bVar2) goto LAB_00baec9d;
    *puVar6 = 0;
  }
  return;
}

Assistant:

void JavascriptRegExpConstructor::EnsureValues()
    {
        if (reset)
        {
            ScriptContext* scriptContext = this->GetScriptContext();
            const CharCount lastInputLen = lastInput->GetLength();
            const char16* lastInputStr = lastInput->GetString();
            UnifiedRegex::RegexPattern* pattern = lastPattern;

            // When we perform a regex test operation it's possible the result of the operation will be loaded from a cache and the match will not be computed and updated in the ctor.
            // In that case we invalidate the last match stored in the ctor and will need to compute it before it will be accessible via $1 etc.
            // Since we only do this for the case of RegExp.prototype.test cache hit, we know several things:
            //  - The regex is not global or sticky
            //  - There was a match (test returned true)
            if (invalidatedLastMatch)
            {
                this->lastMatch = RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, 0);
                invalidatedLastMatch = false;
            }

            Assert(!lastMatch.IsUndefined());
            JavascriptString* emptyString = scriptContext->GetLibrary()->GetEmptyString();
            CharCount lastIndexVal = lastMatch.EndOffset();
            this->index = JavascriptNumber::ToVar(lastMatch.offset, scriptContext);
            this->lastIndex = JavascriptNumber::ToVar(lastIndexVal, scriptContext);
            this->leftContext = lastMatch.offset > 0 ? SubString::New(lastInput, 0, lastMatch.offset) : emptyString;
            this->rightContext = lastIndexVal > 0 && lastIndexVal < lastInputLen ? SubString::New(lastInput, lastIndexVal, lastInputLen - lastIndexVal) : emptyString;

            Var nonMatchValue = RegexHelper::NonMatchValue(scriptContext, true);
            captures[0] = RegexHelper::GetString(scriptContext, lastInput, nonMatchValue, lastMatch);
            int numGroups = pattern->NumGroups();
            if (numGroups > 1)
            {
                // The RegExp constructor's lastMatch holds the last *successful* match on any regular expression.
                // That regular expression may since have been used for *unsuccessful* matches, in which case
                // its groups will have been reset. Updating the RegExp constructor with the group binding after
                // every match is prohibitively slow. Instead, run the match again using the known last input string.
                if (!pattern->WasLastMatchSuccessful())
                {
                    RegexHelper::SimpleMatch(scriptContext, pattern, lastInputStr, lastInputLen, lastMatch.offset);
                }
                Assert(pattern->WasLastMatchSuccessful());
                for (int groupId = 1; groupId < min(numGroups, NumCtorCaptures); groupId++)
                    captures[groupId] = RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, groupId);

                this->lastParen = numGroups <= NumCtorCaptures ?
                    PointerValue(captures[numGroups - 1]) :
                    RegexHelper::GetGroup(scriptContext, pattern, lastInput, nonMatchValue, numGroups - 1);
            }
            else
            {
                this->lastParen = emptyString;
            }
            for (int groupId = numGroups; groupId < NumCtorCaptures; groupId++)
                captures[groupId] = emptyString;
            reset = false;
        }
        else
        {
            // If we are not resetting the values, the last match cannot be invalidated.
            Assert(!invalidatedLastMatch);
        }
    }